

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
Insert<phmap::parallel_flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_std::mutex>_>
::TestBody(Insert<phmap::parallel_flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  result_type_conflict1 rVar1;
  mt19937_64 *__urng;
  long lVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  T val2;
  T val;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::iterator,_bool>
  p;
  TypeParam m;
  AssertHelper local_800;
  AssertHelper local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7f0;
  undefined1 local_7e8 [8];
  Inner *pIStack_7e0;
  __native_type local_7d8;
  AssertHelper local_7b0;
  undefined1 local_7a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_798;
  result_type_conflict1 local_788;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_780;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::iterator,_bool>
  local_758;
  long lStack_720;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_718;
  
  hash_internal::
  Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>
  ::operator()(&local_780,
               (Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>
                *)&local_718);
  lVar2 = 0x68;
  do {
    *(undefined8 *)((long)&local_758.first.inner_end_ + lVar2) = 0;
    *(undefined8 *)((long)&local_758.first.it_.ctrl_ + lVar2) = 0;
    *(undefined8 *)((long)&local_780.second + lVar2) = 0;
    *(undefined8 *)((long)&local_758.first.inner_ + lVar2) = 0;
    *(undefined8 *)((long)&local_780.first.field_2 + lVar2) = 0;
    *(undefined8 *)((long)&local_780.first.field_2 + lVar2 + 8) = 0;
    *(undefined8 *)((long)&local_780.first._M_dataplus._M_p + lVar2) = 0;
    *(undefined8 *)((long)&local_780.first._M_string_length + lVar2) = 0;
    *(undefined8 *)((long)&local_758.first.it_.field_1 + lVar2) = 0;
    *(undefined8 *)((long)&local_758.first.it_end_.field_1 + lVar2) = 0;
    *(long *)(&local_758.second + lVar2) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)&lStack_720 + lVar2) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_718.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar2) = 0;
    lVar2 = lVar2 + 0x70;
  } while (lVar2 != 0x768);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::
  emplace<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&,_0>
            (&local_758,&local_718,&local_780);
  local_7a8[0] = local_758.second;
  local_7a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_758.second == false) {
    testing::Message::Message((Message *)&local_7f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_7e8,(internal *)local_7a8,(AssertionResult *)"p.second","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_800,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x39,(char *)local_7e8);
    testing::internal::AssertHelper::operator=(&local_800,(Message *)&local_7f8);
    testing::internal::AssertHelper::~AssertHelper(&local_800);
    if (local_7e8 != (undefined1  [8])&local_7d8) {
      operator_delete((void *)local_7e8,(ulong)(local_7d8.__align + 1));
    }
    if ((long *)CONCAT71(local_7f8.data_._1_7_,local_7f8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_7f8.data_._1_7_,local_7f8.data_._0_1_) + 8))();
    }
    if (local_7a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_7a0,local_7a0);
    }
  }
  testing::internal::
  CmpHelperEQ<std::pair<std::__cxx11::string_const,int>,std::pair<std::__cxx11::string_const,int>>
            ((internal *)local_7e8,"val","*p.first",&local_780,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)local_758.first.it_.field_1.slot_);
  if (local_7e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_7a8);
    if (pIStack_7e0 == (Inner *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)(pIStack_7e0->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7f8,(Message *)local_7a8);
    testing::internal::AssertHelper::~AssertHelper(&local_7f8);
    if (local_7a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_7a8 + 8))();
    }
  }
  if (pIStack_7e0 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pIStack_7e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pIStack_7e0);
  }
  local_7e8 = (undefined1  [8])0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)local_7e8,__urng,(param_type *)local_7e8);
  local_7a8 = (undefined1  [8])&local_798;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_7a8,local_780.first._M_dataplus._M_p,
             local_780.first._M_dataplus._M_p + local_780.first._M_string_length);
  local_788 = rVar1;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::
  emplace<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&,_0>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::iterator,_bool>
              *)local_7e8,&local_718,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)local_7a8);
  local_758.first.it_end_.ctrl_ = (ctrl_t *)local_7d8._16_8_;
  local_758.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)local_7d8.__data.__list.__prev;
  local_758.first.it_.ctrl_ = (ctrl_t *)local_7d8.__align;
  local_758.first.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_7d8._8_8_;
  local_758.first.inner_ = (Inner *)local_7e8;
  local_758.first.inner_end_ = pIStack_7e0;
  local_758.second = (bool)local_7d8.__size[0x20];
  local_7f8.data_._0_1_ = (internal)(local_7d8.__size[0x20] ^ 1);
  local_7f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_7d8.__size[0x20] != 0) {
    testing::Message::Message((Message *)&local_800);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_7e8,(internal *)&local_7f8,(AssertionResult *)"p.second","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3d,(char *)local_7e8);
    testing::internal::AssertHelper::operator=(&local_7b0,(Message *)&local_800);
    testing::internal::AssertHelper::~AssertHelper(&local_7b0);
    if (local_7e8 != (undefined1  [8])&local_7d8) {
      operator_delete((void *)local_7e8,(ulong)(local_7d8.__align + 1));
    }
    if (local_800.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_800.data_ + 8))();
    }
    if (local_7f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_7f0,local_7f0);
    }
  }
  testing::internal::
  CmpHelperEQ<std::pair<std::__cxx11::string_const,int>,std::pair<std::__cxx11::string_const,int>>
            ((internal *)local_7e8,"val","*p.first",&local_780,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)local_758.first.it_.field_1.slot_);
  if (local_7e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7f8);
    if (pIStack_7e0 == (Inner *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)(pIStack_7e0->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_800,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_800,(Message *)&local_7f8);
    testing::internal::AssertHelper::~AssertHelper(&local_800);
    if ((long *)CONCAT71(local_7f8.data_._1_7_,local_7f8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_7f8.data_._1_7_,local_7f8.data_._0_1_) + 8))();
    }
  }
  if (pIStack_7e0 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pIStack_7e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pIStack_7e0);
  }
  if (local_7a8 != (undefined1  [8])&local_798) {
    operator_delete((void *)local_7a8,local_798._M_allocated_capacity + 1);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~parallel_hash_set(&local_718);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780.first._M_dataplus._M_p != &local_780.first.field_2) {
    operator_delete(local_780.first._M_dataplus._M_p,
                    local_780.first.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, Insert) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto p = m.insert(val);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(val, *p.first);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  p = m.insert(val2);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(val, *p.first);
}